

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.h
# Opt level: O2

void __thiscall SQObjectPtr::Null(SQObjectPtr *this)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  
  pSVar3 = (this->super_SQObject)._unVal.pTable;
  (this->super_SQObject)._unVal.pTable = (SQTable *)0x0;
  SVar2 = (this->super_SQObject)._type;
  (this->super_SQObject)._type = OT_NULL;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
      return;
    }
  }
  return;
}

Assistant:

inline void Null()
    {
        SQObjectType tOldType = _type;
        SQObjectValue unOldVal = _unVal;
        _type = OT_NULL;
        _unVal.raw = (SQRawObjectVal)NULL;
        __Release(tOldType ,unOldVal);
    }